

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

ALLEGRO_DISPLAY * al_create_display(int w,int h)

{
  ALLEGRO_COLOR color;
  _Bool _Var1;
  undefined8 in_RAX;
  ALLEGRO_SYSTEM *pAVar2;
  ALLEGRO_DISPLAY_INTERFACE *pAVar3;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_SHADER *shader;
  char *msg;
  
  pAVar2 = al_get_system_driver();
  pAVar3 = (*pAVar2->vt->get_display_driver)();
  if (pAVar3 == (ALLEGRO_DISPLAY_INTERFACE *)0x0) {
    _Var1 = _al_trace_prefix("display",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/display.c"
                             ,0x31,"al_create_display");
    if (_Var1) {
      msg = "Failed to create display (no display driver)\n";
      goto LAB_001569a9;
    }
  }
  else {
    display = (*pAVar3->create_display)(w,h);
    if (display != (ALLEGRO_DISPLAY *)0x0) {
      if (-1 < (int)((uint)(display->extra_settings).suggested |
                    (uint)(display->extra_settings).required)) {
        (display->extra_settings).settings[0x1f] = 1;
      }
      display->use_constraints = false;
      display->extra_resize_height = 0;
      display->num_cache_vertices = 0;
      display->cache_enabled = false;
      display->vertex_cache_size = 0;
      display->min_w = 0;
      display->min_h = 0;
      display->max_w = 0;
      display->max_h = 0;
      display->vertex_cache = (void *)0x0;
      display->cache_texture = 0;
      al_identity_transform(&display->projview_transform);
      display->default_shader = (ALLEGRO_SHADER *)0x0;
      _al_vector_init(&display->display_invalidated_callbacks,8);
      _al_vector_init(&display->display_validated_callbacks,8);
      (display->render_state).write_mask = 0x1f;
      (display->render_state).depth_test = 0;
      (display->render_state).depth_function = 2;
      (display->render_state).alpha_test = 0;
      (display->render_state).alpha_function = 1;
      (display->render_state).alpha_test_value = 0;
      _al_vector_init(&display->bitmaps,8);
      if ((display->extra_settings).settings[0x18] == 0) {
        _Var1 = _al_trace_prefix("display",0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/display.c"
                                 ,99,"al_create_display");
        if (_Var1) {
          _al_trace_suffix("ALLEGRO_COMPATIBLE_DISPLAY not set\n");
        }
        _al_set_current_display_only(display);
      }
      else {
        bitmap = (*display->vt->get_backbuffer)(display);
        al_set_target_bitmap(bitmap);
      }
      if (((uint)display->flags >> 0xb & 1) != 0) {
        shader = _al_create_default_shader(display->flags);
        display->default_shader = shader;
        if (shader == (ALLEGRO_SHADER *)0x0) {
          al_destroy_display(display);
          return (ALLEGRO_DISPLAY *)0x0;
        }
        al_use_shader(shader);
      }
      if ((display->extra_settings).settings[0x18] != 0) {
        al_map_rgb('\0','\0','\0');
        color.b = (float)(int)in_RAX;
        color.a = (float)(int)((ulong)in_RAX >> 0x20);
        color.r = 1.966638e-39;
        color.g = 0.0;
        al_clear_to_color(color);
      }
      if ((display->extra_settings).settings[0x1f] != 0) {
        al_convert_memory_bitmaps();
        return display;
      }
      return display;
    }
    _Var1 = _al_trace_prefix("display",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/display.c"
                             ,0x37,"al_create_display");
    if (_Var1) {
      msg = "Failed to create display (NULL)\n";
LAB_001569a9:
      _al_trace_suffix(msg);
      return (ALLEGRO_DISPLAY *)0x0;
    }
  }
  return (ALLEGRO_DISPLAY *)0x0;
}

Assistant:

ALLEGRO_DISPLAY *al_create_display(int w, int h)
{
   ALLEGRO_SYSTEM *system;
   ALLEGRO_DISPLAY_INTERFACE *driver;
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EXTRA_DISPLAY_SETTINGS *settings;
   int flags;

   system = al_get_system_driver();
   driver = system->vt->get_display_driver();
   if (!driver) {
      ALLEGRO_ERROR("Failed to create display (no display driver)\n");
      return NULL;
   }

   display = driver->create_display(w, h);
   if (!display) {
      ALLEGRO_ERROR("Failed to create display (NULL)\n");
      return NULL;
   }

   ASSERT(display->vt);

   settings = &display->extra_settings;
   flags = settings->required | settings->suggested;
   if (!(flags & (1 << ALLEGRO_AUTO_CONVERT_BITMAPS))) {
      settings->settings[ALLEGRO_AUTO_CONVERT_BITMAPS] = 1;
   }

   display->min_w = 0;
   display->min_h = 0;
   display->max_w = 0;
   display->max_h = 0;
   display->use_constraints = false;
   display->extra_resize_height = 0;

   display->vertex_cache = 0;
   display->num_cache_vertices = 0;
   display->cache_enabled = false;
   display->vertex_cache_size = 0;
   display->cache_texture = 0;
   al_identity_transform(&display->projview_transform);

   display->default_shader = NULL;

   _al_vector_init(&display->display_invalidated_callbacks, sizeof(void *));
   _al_vector_init(&display->display_validated_callbacks, sizeof(void *));

   display->render_state.write_mask = ALLEGRO_MASK_RGBA | ALLEGRO_MASK_DEPTH;
   display->render_state.depth_test = false;
   display->render_state.depth_function = ALLEGRO_RENDER_LESS;
   display->render_state.alpha_test = false;
   display->render_state.alpha_function = ALLEGRO_RENDER_ALWAYS;
   display->render_state.alpha_test_value = 0;

   _al_vector_init(&display->bitmaps, sizeof(ALLEGRO_BITMAP*));

   if (settings->settings[ALLEGRO_COMPATIBLE_DISPLAY]) {
      al_set_target_bitmap(al_get_backbuffer(display));
   }
   else {
      ALLEGRO_DEBUG("ALLEGRO_COMPATIBLE_DISPLAY not set\n");
      _al_set_current_display_only(display);
   }

   if (display->flags & ALLEGRO_PROGRAMMABLE_PIPELINE) {
      display->default_shader = _al_create_default_shader(display->flags);
      if (!display->default_shader) {
         al_destroy_display(display);
         return NULL;
      }
      al_use_shader(display->default_shader);
   }

   /* Clear the screen */
   if (settings->settings[ALLEGRO_COMPATIBLE_DISPLAY]) {
      al_clear_to_color(al_map_rgb(0, 0, 0));

      /* TODO:
       * on iphone, don't kill the initial splashscreen - in fact, it's also
       * annoying in linux to have an extra black frame as first frame and I
       * suppose we never really want it
       */
#if 0
      al_flip_display();
#endif
   }

   if (settings->settings[ALLEGRO_AUTO_CONVERT_BITMAPS]) {
      /* We convert video bitmaps to memory bitmaps when the display is
       * destroyed, so seems only fair to re-convertt hem when the
       * display is re-created again.
       */
      al_convert_memory_bitmaps();
   }

   return display;
}